

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_setup.cpp
# Opt level: O0

void P_LoadBehavior(MapData *map)

{
  FileReader *fr;
  bool bVar1;
  DWORD DVar2;
  MapData *map_local;
  
  DVar2 = MapData::Size(map,0xb);
  if (DVar2 != 0) {
    MapData::Seek(map,0xb);
    fr = map->file;
    DVar2 = MapData::Size(map,0xb);
    FBehavior::StaticLoadModule(-1,fr,DVar2);
  }
  bVar1 = FBehavior::StaticCheckAllGood();
  if (!bVar1) {
    Printf("ACS scripts unloaded.\n");
    FBehavior::StaticUnloadModules();
  }
  return;
}

Assistant:

void P_LoadBehavior(MapData * map)
{
	if (map->Size(ML_BEHAVIOR) > 0)
	{
		map->Seek(ML_BEHAVIOR);
		FBehavior::StaticLoadModule(-1, map->file, map->Size(ML_BEHAVIOR));
	}
	if (!FBehavior::StaticCheckAllGood())
	{
		Printf("ACS scripts unloaded.\n");
		FBehavior::StaticUnloadModules();
	}
}